

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPack.c
# Opt level: O1

Vec_Int_t * Gia_ManLutCollect(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  
  iVar1 = p->nObjs;
  uVar16 = ~(p->vCos->nSize + p->vCis->nSize);
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < (iVar1 + uVar16) - 1) {
    iVar10 = iVar1 + uVar16;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar10;
  if (iVar10 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar10 << 2);
  }
  p_00->pArray = piVar4;
  uVar16 = p->nObjs;
  if (1 < (int)uVar16) {
    lVar17 = 1;
    do {
      if (p->vMapping->nSize <= lVar17) goto LAB_00700d11;
      if (p->vMapping->pArray[lVar17] != 0) {
        Vec_IntPush(p_00,(int)lVar17);
      }
      lVar17 = lVar17 + 1;
      uVar16 = p->nObjs;
    } while (lVar17 < (int)uVar16);
  }
  uVar14 = 0x10;
  if (0xe < uVar16 - 1) {
    uVar14 = uVar16;
  }
  if (uVar14 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)(int)uVar14 << 2);
  }
  memset(piVar4,0,(long)(int)uVar16 << 2);
  pVVar8 = p->vCos;
  if (0 < pVVar8->nSize) {
    piVar7 = pVVar8->pArray;
    lVar17 = 0;
    do {
      iVar1 = piVar7[lVar17];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar14 = iVar1 - (*(uint *)(p->pObjs + iVar1) & 0x1fffffff);
      if (((int)uVar14 < 0) || ((int)uVar16 <= (int)uVar14)) goto LAB_00700d4f;
      piVar4[uVar14] = 1;
      lVar17 = lVar17 + 1;
    } while (lVar17 < pVVar8->nSize);
  }
  uVar14 = p_00->nSize;
  uVar15 = (ulong)(int)uVar14;
  if (0 < (long)uVar15) {
    piVar7 = p_00->pArray;
    uVar13 = uVar15;
    do {
      iVar1 = piVar7[uVar13 - 1];
      lVar17 = (long)iVar1;
      if ((lVar17 < 0) || ((int)uVar16 <= iVar1)) goto LAB_00700d11;
      pVVar8 = p->vMapping;
      iVar10 = pVVar8->nSize;
      if (iVar10 <= iVar1) goto LAB_00700d11;
      iVar2 = piVar4[lVar17];
      piVar9 = pVVar8->pArray;
      lVar12 = 0;
      while( true ) {
        lVar5 = (long)piVar9[lVar17];
        if ((lVar5 < 0) || (iVar10 <= piVar9[lVar17])) goto LAB_00700d11;
        if (piVar9[lVar5] <= lVar12) break;
        lVar6 = (long)piVar9[lVar5 + lVar12 + 1];
        if ((lVar6 < 0) || ((int)uVar16 <= piVar9[lVar5 + lVar12 + 1])) goto LAB_00700d11;
        if (piVar4[lVar6] <= iVar2) {
          piVar4[lVar6] = iVar2 + 1;
        }
        lVar12 = lVar12 + 1;
        iVar10 = pVVar8->nSize;
        if (iVar10 <= iVar1) goto LAB_00700d11;
      }
      bVar3 = 1 < (long)uVar13;
      uVar13 = uVar13 - 1;
    } while (bVar3);
  }
  if ((int)uVar14 < 1) {
    uVar13 = 0;
  }
  else {
    piVar7 = p_00->pArray;
    uVar13 = 0;
    uVar11 = 0;
    if (0 < (int)uVar16) {
      uVar11 = (ulong)uVar16;
    }
    do {
      iVar1 = piVar7[uVar13];
      if (((long)iVar1 < 0) || ((int)uVar16 <= iVar1)) goto LAB_00700d11;
      if (uVar11 == uVar13) {
LAB_00700d4f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      piVar4[uVar13] = -piVar4[iVar1];
      uVar13 = uVar13 + 1;
    } while (uVar15 != uVar13);
  }
  if ((int)uVar16 < (int)uVar13) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  piVar7 = Abc_MergeSortCost(piVar4,(int)uVar13);
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  uVar16 = 0x10;
  if (0xe < uVar14 - 1) {
    uVar16 = uVar14;
  }
  pVVar8->nSize = 0;
  pVVar8->nCap = uVar16;
  if (uVar16 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)(int)uVar16 << 2);
  }
  pVVar8->pArray = piVar9;
  if (0 < (int)uVar14) {
    uVar13 = 0;
    do {
      if (uVar14 <= (uint)piVar7[uVar13]) {
LAB_00700d11:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(pVVar8,p_00->pArray[(uint)piVar7[uVar13]]);
      uVar13 = uVar13 + 1;
    } while (uVar15 != uVar13);
  }
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (piVar7 != (int *)0x0) {
    free(piVar7);
  }
  return pVVar8;
}

Assistant:

Vec_Int_t * Gia_ManLutCollect( Gia_Man_t * p )
{
    Vec_Int_t * vLuts, * vDist, * vOrder;
    int i, k, Id, iFan, * pPerm;
    // collect LUTs
    vLuts = Vec_IntAlloc( Gia_ManAndNum(p) );
    Gia_ManForEachLut( p, Id )
        Vec_IntPush( vLuts, Id );
    // propagate distance
    vDist = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachCoDriverId( p, Id, i )
        Vec_IntWriteEntry( vDist, Id, 1 );
    Vec_IntForEachEntryReverse( vLuts, Id, i )
    {
        int Dist = 1 + Vec_IntEntry(vDist, Id);
        Gia_LutForEachFanin( p, Id, iFan, k )
            Vec_IntUpdateEntry( vDist, iFan, Dist );
    }
    // sort LUTs by distance
    k = 0;
    Vec_IntForEachEntry( vLuts, Id, i )
        Vec_IntWriteEntry( vDist, k++, -Vec_IntEntry(vDist, Id) );
    Vec_IntShrink( vDist, k );
    pPerm = Abc_MergeSortCost( Vec_IntArray(vDist), Vec_IntSize(vDist) );
    // collect
    vOrder = Vec_IntAlloc( Vec_IntSize(vLuts) );
    for ( i = 0; i < Vec_IntSize(vLuts); i++ )
        Vec_IntPush( vOrder, Vec_IntEntry(vLuts, pPerm[i]) );
    Vec_IntFree( vDist );
    Vec_IntFree( vLuts );
    ABC_FREE( pPerm );
    return vOrder;
}